

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_data_priority_add_child(Curl_easy *parent,Curl_easy *child,_Bool exclusive)

{
  Curl_easy *pCVar1;
  Curl_data_prio_node *pCVar2;
  Curl_data_prio_node *local_40;
  Curl_data_prio_node *node;
  Curl_data_prio_node *pnode;
  Curl_data_prio_node **tail;
  _Bool exclusive_local;
  Curl_easy *child_local;
  Curl_easy *parent_local;
  
  if ((child->set).priority.parent != (Curl_easy *)0x0) {
    priority_remove_child((child->set).priority.parent,child);
  }
  if (parent != (Curl_easy *)0x0) {
    pCVar2 = (Curl_data_prio_node *)(*Curl_ccalloc)(1,0x10);
    if (pCVar2 == (Curl_data_prio_node *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pCVar2->data = child;
    if (((parent->set).priority.children != (Curl_data_prio_node *)0x0) && (exclusive)) {
      for (local_40 = (parent->set).priority.children; local_40 != (Curl_data_prio_node *)0x0;
          local_40 = local_40->next) {
        (local_40->data->set).priority.parent = child;
      }
      for (pnode = (Curl_data_prio_node *)&(child->set).priority.children;
          pnode->next != (Curl_data_prio_node *)0x0; pnode = pnode->next) {
      }
      pnode->next = (parent->set).priority.children;
      (parent->set).priority.children = (Curl_data_prio_node *)0x0;
    }
    for (pnode = (Curl_data_prio_node *)&(parent->set).priority.children;
        pnode->next != (Curl_data_prio_node *)0x0; pnode = pnode->next) {
      pCVar1 = pnode->next->data;
      (pCVar1->set).priority.field_0x14 = (pCVar1->set).priority.field_0x14 & 0xfe;
    }
    pnode->next = pCVar2;
  }
  (child->set).priority.parent = parent;
  (child->set).priority.field_0x14 = (child->set).priority.field_0x14 & 0xfe | exclusive;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_data_priority_add_child(struct Curl_easy *parent,
                                      struct Curl_easy *child,
                                      bool exclusive)
{
  if(child->set.priority.parent) {
    priority_remove_child(child->set.priority.parent, child);
  }

  if(parent) {
    struct Curl_data_prio_node **tail;
    struct Curl_data_prio_node *pnode;

    pnode = calloc(1, sizeof(*pnode));
    if(!pnode)
      return CURLE_OUT_OF_MEMORY;
    pnode->data = child;

    if(parent->set.priority.children && exclusive) {
      /* exclusive: move all existing children underneath the new child */
      struct Curl_data_prio_node *node = parent->set.priority.children;
      while(node) {
        node->data->set.priority.parent = child;
        node = node->next;
      }

      tail = &child->set.priority.children;
      while(*tail)
        tail = &(*tail)->next;

      DEBUGASSERT(!*tail);
      *tail = parent->set.priority.children;
      parent->set.priority.children = 0;
    }

    tail = &parent->set.priority.children;
    while(*tail) {
      (*tail)->data->set.priority.exclusive = FALSE;
      tail = &(*tail)->next;
    }

    DEBUGASSERT(!*tail);
    *tail = pnode;
  }

  child->set.priority.parent = parent;
  child->set.priority.exclusive = exclusive;
  return CURLE_OK;
}